

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterSetIndentString(xmlTextWriterPtr writer,xmlChar *str)

{
  int iVar1;
  xmlChar *pxVar2;
  
  iVar1 = -1;
  if (str != (xmlChar *)0x0 && writer != (xmlTextWriterPtr)0x0) {
    if (writer->ichar != (xmlChar *)0x0) {
      (*xmlFree)(writer->ichar);
    }
    pxVar2 = xmlStrdup(str);
    writer->ichar = pxVar2;
    iVar1 = -(uint)(pxVar2 == (xmlChar *)0x0);
  }
  return iVar1;
}

Assistant:

int
xmlTextWriterSetIndentString(xmlTextWriterPtr writer, const xmlChar * str)
{
    if ((writer == NULL) || (!str))
        return -1;

    if (writer->ichar != NULL)
        xmlFree(writer->ichar);
    writer->ichar = xmlStrdup(str);

    if (!writer->ichar)
        return -1;
    else
        return 0;
}